

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_subcommand_abi_cxx11_(Formatter *this,App *sub)

{
  _Setw _Var1;
  ostream *poVar2;
  App *in_RDX;
  long in_RSI;
  string *in_RDI;
  bool in_stack_00000097;
  string *in_stack_00000098;
  size_t in_stack_000000a0;
  string *in_stack_000000a8;
  ostream *in_stack_000000b0;
  string name;
  stringstream out;
  App *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  ulong uVar3;
  char *in_stack_fffffffffffffcd8;
  allocator *paVar4;
  string *in_stack_fffffffffffffcf0;
  FormatterBase *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0 [7];
  undefined1 in_stack_fffffffffffffd67;
  App *in_stack_fffffffffffffd68;
  bool local_276;
  undefined1 local_275 [5];
  string local_270 [32];
  string local_250 [32];
  string local_230 [48];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  App *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  App::get_display_name_abi_cxx11_(in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
  ::std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  local_275[3] = 0;
  local_275[2] = 0;
  local_275[1] = 0;
  local_276 = App::get_required(local_18);
  if (local_276) {
    ::std::allocator<char>::allocator();
    local_275[3] = 1;
    ::std::__cxx11::string::string(local_270,"REQUIRED",(allocator *)(local_275 + 4));
    local_275[2] = 1;
    FormatterBase::get_label(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    local_275[1] = 1;
    ::std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  }
  else {
    in_stack_fffffffffffffd08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_275;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_230,"",(allocator *)in_stack_fffffffffffffd08);
  }
  local_276 = !local_276;
  ::std::operator+(in_stack_fffffffffffffd08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  ::std::__cxx11::string::~string(local_230);
  if (local_276) {
    ::std::allocator<char>::~allocator((allocator<char> *)local_275);
  }
  if ((local_275[1] & 1) != 0) {
    ::std::__cxx11::string::~string(local_250);
  }
  if ((local_275[2] & 1) != 0) {
    ::std::__cxx11::string::~string(local_270);
  }
  if ((local_275[3] & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)(local_275 + 4));
  }
  ::std::__cxx11::string::~string(local_1e0);
  ::std::__cxx11::string::~string(local_200);
  poVar2 = local_190;
  _Var1 = std::setw(*(int *)(in_RSI + 8));
  poVar2 = ::std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,std::left);
  ::std::operator<<(poVar2,local_1c0);
  App::get_description_abi_cxx11_(in_stack_fffffffffffffcc8);
  uVar3 = *(ulong *)(in_RSI + 8);
  paVar4 = &local_2c1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2c0,uVar3,' ',paVar4);
  detail::streamOutAsParagraph
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000097);
  ::std::__cxx11::string::~string(local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  ::std::__cxx11::string::~string(local_2a0);
  ::std::operator<<(local_190,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::string::~string(local_1c0);
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    std::string name = "  " + sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : "");

    out << std::setw(static_cast<int>(column_width_)) << std::left << name;
    detail::streamOutAsParagraph(
        out, sub->get_description(), right_column_width_, std::string(column_width_, ' '), true);
    out << '\n';
    return out.str();
}